

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O3

int parse_path_key_expr(char *id,char **prefix,int *pref_len,char **name,int *nam_len,
                       int *parent_times)

{
  ushort *puVar1;
  int iVar2;
  ushort **ppuVar3;
  char cVar4;
  int iVar5;
  char *pcVar6;
  int iVar7;
  int iVar8;
  
  if (id == (char *)0x0) {
    __assert_fail("id",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/resolve.c"
                  ,0x17c,
                  "int parse_path_key_expr(const char *, const char **, int *, const char **, int *, int *)"
                 );
  }
  if (parent_times == (int *)0x0) {
    __assert_fail("parent_times",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/resolve.c"
                  ,0x17d,
                  "int parse_path_key_expr(const char *, const char **, int *, const char **, int *, int *)"
                 );
  }
  if (prefix != (char **)0x0) {
    *prefix = (char *)0x0;
  }
  if (pref_len != (int *)0x0) {
    *pref_len = 0;
  }
  if (name != (char **)0x0) {
    *name = (char *)0x0;
  }
  if (nam_len != (int *)0x0) {
    *nam_len = 0;
  }
  iVar2 = *parent_times;
  if (iVar2 == 0) {
    iVar8 = strncmp(id,"current()",9);
    if (iVar8 != 0) {
      return 0;
    }
    pcVar6 = id + 9;
    ppuVar3 = __ctype_b_loc();
    puVar1 = *ppuVar3;
    cVar4 = id[9];
    if ((*(byte *)((long)puVar1 + (long)cVar4 * 2 + 1) & 0x20) == 0) {
      iVar8 = 9;
    }
    else {
      iVar8 = 9;
      do {
        iVar8 = iVar8 + 1;
        cVar4 = pcVar6[1];
        pcVar6 = pcVar6 + 1;
      } while ((*(byte *)((long)puVar1 + (long)cVar4 * 2 + 1) & 0x20) != 0);
    }
    if (cVar4 != '/') goto LAB_0011dc70;
    id = pcVar6 + 2;
    do {
      iVar7 = iVar8;
      pcVar6 = id;
      iVar8 = iVar7 + 1;
      id = pcVar6 + 1;
    } while ((*(byte *)((long)puVar1 + (long)pcVar6[-1] * 2 + 1) & 0x20) != 0);
    if ((pcVar6[-1] != '.') || (*pcVar6 != '.')) goto LAB_0011dc70;
    iVar8 = iVar7 + 3;
    cVar4 = *id;
    iVar7 = 1;
    while ((*(byte *)((long)puVar1 + (long)cVar4 * 2 + 1) & 0x20) != 0) {
      iVar8 = iVar8 + 1;
      cVar4 = id[1];
      id = id + 1;
    }
  }
  else {
    cVar4 = *id;
    iVar8 = 0;
    iVar7 = 0;
  }
  if (cVar4 == '/') {
    ppuVar3 = __ctype_b_loc();
    puVar1 = *ppuVar3;
    do {
      iVar8 = iVar8 + 1;
      cVar4 = id[1];
      id = id + 1;
      iVar5 = iVar8;
      pcVar6 = id;
    } while ((*(byte *)((long)puVar1 + (long)cVar4 * 2 + 1) & 0x20) != 0);
    while ((cVar4 == '.' && (pcVar6[1] == '.'))) {
      if (iVar2 != 0) goto LAB_0011dc7b;
      iVar5 = iVar5 + 2;
      cVar4 = pcVar6[2];
      pcVar6 = pcVar6 + 2;
      while ((*(byte *)((long)puVar1 + (long)cVar4 * 2 + 1) & 0x20) != 0) {
        iVar5 = iVar5 + 1;
        cVar4 = pcVar6[1];
        pcVar6 = pcVar6 + 1;
      }
      if (cVar4 != '/') {
        return -iVar5;
      }
      iVar7 = iVar7 + 1;
      do {
        iVar5 = iVar5 + 1;
        cVar4 = pcVar6[1];
        pcVar6 = pcVar6 + 1;
      } while ((*(byte *)((long)puVar1 + (long)cVar4 * 2 + 1) & 0x20) != 0);
    }
    id = pcVar6;
    iVar8 = iVar5;
    if (iVar2 == 0) {
      *parent_times = iVar7;
    }
LAB_0011dc7b:
    iVar2 = parse_node_identifier(id,prefix,pref_len,name,nam_len);
    if (0 < iVar2) {
      return iVar2 + iVar8;
    }
    return iVar2 - iVar8;
  }
LAB_0011dc70:
  return -iVar8;
}

Assistant:

static int
parse_path_key_expr(const char *id, const char **prefix, int *pref_len, const char **name, int *nam_len,
                    int *parent_times)
{
    int parsed = 0, ret, par_times = 0;

    assert(id);
    assert(parent_times);
    if (prefix) {
        *prefix = NULL;
    }
    if (pref_len) {
        *pref_len = 0;
    }
    if (name) {
        *name = NULL;
    }
    if (nam_len) {
        *nam_len = 0;
    }

    if (!*parent_times) {
        /* current-function-invocation *WSP "/" *WSP rel-path-keyexpr */
        if (strncmp(id, "current()", 9)) {
            return -parsed;
        }

        parsed += 9;
        id += 9;

        while (isspace(id[0])) {
            ++parsed;
            ++id;
        }

        if (id[0] != '/') {
            return -parsed;
        }

        ++parsed;
        ++id;

        while (isspace(id[0])) {
            ++parsed;
            ++id;
        }

        /* rel-path-keyexpr */
        if (strncmp(id, "..", 2)) {
            return -parsed;
        }
        ++par_times;

        parsed += 2;
        id += 2;

        while (isspace(id[0])) {
            ++parsed;
            ++id;
        }
    }

    /* 1*(".." *WSP "/" *WSP) *(node-identifier *WSP "/" *WSP) node-identifier
     *
     * first parent reference with whitespaces already parsed
     */
    if (id[0] != '/') {
        return -parsed;
    }

    ++parsed;
    ++id;

    while (isspace(id[0])) {
        ++parsed;
        ++id;
    }

    while (!strncmp(id, "..", 2) && !*parent_times) {
        ++par_times;

        parsed += 2;
        id += 2;

        while (isspace(id[0])) {
            ++parsed;
            ++id;
        }

        if (id[0] != '/') {
            return -parsed;
        }

        ++parsed;
        ++id;

        while (isspace(id[0])) {
            ++parsed;
            ++id;
        }
    }

    if (!*parent_times) {
        *parent_times = par_times;
    }

    /* all parent references must be parsed at this point */
    if ((ret = parse_node_identifier(id, prefix, pref_len, name, nam_len)) < 1) {
        return -parsed+ret;
    }

    parsed += ret;
    id += ret;

    return parsed;
}